

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

pssize p_socket_send_to(PSocket *socket,PSocketAddress *address,pchar *buffer,psize buflen,
                       PError **error)

{
  pboolean pVar1;
  pint err_code_00;
  psize pVar2;
  ssize_t sVar3;
  pint err_code;
  pssize ret;
  undefined1 local_c0 [4];
  socklen_t optlen;
  sockaddr_storage sa;
  PErrorIO sock_err;
  PError **error_local;
  psize buflen_local;
  pchar *buffer_local;
  PSocketAddress *address_local;
  PSocket *socket_local;
  
  if (((socket == (PSocket *)0x0) || (address == (PSocketAddress *)0x0)) || (buffer == (pchar *)0x0)
     ) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 != 0) {
      pVar1 = p_socket_address_to_native(address,local_c0,0x80);
      if (pVar1 == 0) {
        p_error_set_error_p(error,0x20a,0,"Failed to convert socket address to native structure");
      }
      else {
        pVar2 = p_socket_address_get_native_size(address);
        while( true ) {
          do {
            if (((socket->field_0x18 & 1) != 0) &&
               (pVar1 = p_socket_io_condition_wait(socket,P_SOCKET_IO_CONDITION_POLLOUT,error),
               pVar1 == 0)) {
              return -1;
            }
            sVar3 = sendto(socket->fd,buffer,buflen & 0xffffffff,0,(sockaddr *)local_c0,
                           (socklen_t)pVar2);
            if (-1 < sVar3) {
              return sVar3;
            }
            err_code_00 = p_error_get_last_net();
          } while (err_code_00 == 4);
          sa.__ss_align._4_4_ = p_error_get_io_from_system(err_code_00);
          if (((socket->field_0x18 & 1) == 0) || (sa.__ss_align._4_4_ != P_ERROR_IO_WOULD_BLOCK))
          break;
          sa.__ss_align._4_4_ = 0x1fe;
        }
        p_error_set_error_p(error,sa.__ss_align._4_4_,err_code_00,
                            "Failed to call sendto() on socket");
      }
    }
  }
  return -1;
}

Assistant:

P_LIB_API pssize
p_socket_send_to (const PSocket		*socket,
		  PSocketAddress	*address,
		  const pchar		*buffer,
		  psize			buflen,
		  PError		**error)
{
	PErrorIO		sock_err;
	struct sockaddr_storage sa;
	socklen_t		optlen;
	pssize			ret;
	pint			err_code;

	if (!socket || !address || !buffer) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return -1;
	}

	if (!pp_socket_check (socket, error))
		return -1;

	if (!p_socket_address_to_native (address, &sa, sizeof (sa))) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to convert socket address to native structure");
		return -1;
	}

	optlen = (socklen_t) p_socket_address_get_native_size (address);

	for (;;) {
		if (socket->blocking &&
		    p_socket_io_condition_wait (socket, P_SOCKET_IO_CONDITION_POLLOUT, error) == FALSE)
			return -1;

		if ((ret = sendto (socket->fd,
				   buffer,
				   (socklen_t) buflen,
				   0,
				   (struct sockaddr *) &sa,
				   optlen)) < 0) {
			err_code = p_error_get_last_net ();

#if !defined (P_OS_WIN) && defined (EINTR)
			if (err_code == EINTR)
				continue;
#endif
			sock_err = p_error_get_io_from_system (err_code);

			if (socket->blocking && sock_err == P_ERROR_IO_WOULD_BLOCK)
				continue;

			p_error_set_error_p (error,
					     (pint) sock_err,
					     err_code,
					     "Failed to call sendto() on socket");

			return -1;
		}

		break;
	}

	return ret;
}